

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_im2col::build_graph(test_im2col *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  test_case *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *kernel;
  ggml_tensor *input;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  ggml_type in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  test_case *this_00;
  
  this_00 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x147f44);
  pgVar1 = test_case::ggml_new_tensor
                     (this_00,(ggml_context *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                      (int64_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"input");
  std::array<long,_4UL>::data((array<long,_4UL> *)0x147fa3);
  pgVar2 = test_case::ggml_new_tensor
                     (this_00,(ggml_context *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                      (int64_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ggml_set_name(pgVar2,"kernel");
  pgVar1 = (ggml_tensor *)
           ggml_im2col(in_RSI,pgVar2,pgVar1,*(undefined4 *)(in_RDI + 0x88),
                       *(undefined4 *)(in_RDI + 0x8c),*(undefined4 *)(in_RDI + 0x90),
                       *(undefined4 *)(in_RDI + 0x94),*(undefined4 *)(in_RDI + 0x98),
                       *(undefined4 *)(in_RDI + 0x9c),*(byte *)(in_RDI + 0xa0) & 1,
                       *(undefined4 *)(in_RDI + 0x40));
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, type_input, 4, ne_input.data());
        ggml_set_param(ctx, input);
        ggml_set_name(input, "input");

        ggml_tensor * kernel = ggml_new_tensor(ctx, type_kernel, 4, ne_kernel.data());
        ggml_set_name(kernel, "kernel");

        ggml_tensor * out = ggml_im2col(ctx, kernel, input, s0, s1, p0, p1, d0, d1, is_2D, dst_type);
        ggml_set_name(out, "out");

        return out;
    }